

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBaseExc.cpp
# Opt level: O0

void anon_unknown.dwarf_3b19::test5(void)

{
  ostream *this;
  ArgExc *e;
  
  this = std::operator<<((ostream *)&std::cout,"5");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  throwNested();
  return;
}

Assistant:

void
test5 ()
{
    std::cout << "5" << std::endl;

    try
    {
        throwNested ();
    }
    catch (const IEX_INTERNAL_NAMESPACE::ArgExc& e)
    {
        assert (std::string (e.what ()) == "ArgExc");
    }
}